

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall cmGeneratorTarget::GetExportMacro_abi_cxx11_(cmGeneratorTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  TargetType TVar3;
  cmValue cVar4;
  string *psVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string in;
  string local_58;
  string local_38;
  
  TVar3 = cmTarget::GetType(this->Target);
  if (((TVar3 != SHARED_LIBRARY) &&
      (TVar3 = cmTarget::GetType(this->Target), TVar3 != MODULE_LIBRARY)) &&
     (bVar2 = IsExecutableWithExports(this), !bVar2)) {
    return (string *)0x0;
  }
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"DEFINE_SYMBOL","");
  cVar4 = GetProperty(this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (cVar4.Value == (string *)0x0) {
    psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
    local_58._M_string_length = (size_type)(psVar5->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)psVar5->_M_string_length;
    local_58.field_2._M_allocated_capacity = 8;
    local_58.field_2._8_8_ = (long)"CMAKE_ENABLE_EXPORTS" + 0xc;
    views._M_len = 2;
    views._M_array = (iterator)&local_58;
    cmCatViews_abi_cxx11_(&local_38,views);
    cmsys::SystemTools::MakeCidentifier(&local_58,&local_38);
    std::__cxx11::string::operator=((string *)&this->ExportMacro,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->ExportMacro);
  }
  return &this->ExportMacro;
}

Assistant:

const std::string* cmGeneratorTarget::GetExportMacro() const
{
  // Define the symbol for targets that export symbols.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY ||
      this->IsExecutableWithExports()) {
    if (cmValue custom_export_name = this->GetProperty("DEFINE_SYMBOL")) {
      this->ExportMacro = *custom_export_name;
    } else {
      std::string in = cmStrCat(this->GetName(), "_EXPORTS");
      this->ExportMacro = cmSystemTools::MakeCidentifier(in);
    }
    return &this->ExportMacro;
  }
  return nullptr;
}